

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragBehaviorT<float,float,float>
               (ImGuiDataType data_type,float *v,float v_speed,float v_min,float v_max,char *format,
               ImGuiSliderFlags flags)

{
  bool bVar1;
  float *pfVar2;
  float in_ECX;
  undefined8 in_RDX;
  float *in_RSI;
  float in_EDI;
  float in_XMM0_Da;
  float rhs;
  float fVar3;
  undefined1 auVar4 [64];
  float in_XMM1_Da;
  float in_XMM2_Da;
  ImGuiDataType unaff_retaddr;
  float v_new_parametric_1;
  float v_new_parametric;
  float v_old_parametric;
  int decimal_precision_1;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  float v_old_ref_for_accum_remainder;
  float v_cur;
  bool is_already_past_limits_and_pushing_outward;
  bool is_just_activated;
  int decimal_precision;
  float adjust_delta;
  bool is_floating_point;
  bool is_logarithmic;
  bool is_clamped;
  ImGuiAxis axis;
  ImGuiContext *g;
  bool local_83;
  int in_stack_ffffffffffffff84;
  undefined3 in_stack_ffffffffffffff88;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff8c;
  float local_5c;
  float local_58;
  ImVec2 local_50;
  int local_48;
  float local_44;
  undefined1 in_stack_ffffffffffffffc0;
  float fast_factor;
  ImGuiContext *pIVar6;
  undefined1 in_stack_ffffffffffffffd3;
  ImGuiDataType in_stack_ffffffffffffffe0;
  float in_stack_fffffffffffffffc;
  undefined1 extraout_var [56];
  
  fVar3 = (float)(uint)(((uint)in_ECX & 0x100000) != 0);
  uVar5 = CONCAT13(1,in_stack_ffffffffffffff88);
  if (in_EDI != 1.12104e-44) {
    uVar5 = CONCAT13(in_EDI == 1.26117e-44,in_stack_ffffffffffffff88);
  }
  fast_factor = (float)CONCAT22(CONCAT11(in_XMM1_Da < in_XMM2_Da,((uint)in_ECX & 0x20) != 0),
                                CONCAT11((char)((uint)uVar5 >> 0x18),in_stack_ffffffffffffffc0));
  if ((((in_XMM0_Da == 0.0) && (!NAN(in_XMM0_Da))) && (in_XMM1_Da < in_XMM2_Da)) &&
     (in_XMM2_Da - in_XMM1_Da < 3.4028235e+38)) {
    in_XMM0_Da = (in_XMM2_Da - in_XMM1_Da) * GImGui->DragSpeedDefaultRatio;
  }
  local_44 = 0.0;
  pIVar6 = GImGui;
  if (((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
      (bVar1 = IsMousePosValid((ImVec2 *)0x0), bVar1)) &&
     (bVar1 = IsMouseDragPastThreshold(0,(pIVar6->IO).MouseDragThreshold * 0.5), bVar1)) {
    pfVar2 = ImVec2::operator[](&(pIVar6->IO).MouseDelta,(long)(int)fVar3);
    local_44 = *pfVar2;
    if (((pIVar6->IO).KeyAlt & 1U) != 0) {
      local_44 = local_44 * 0.01;
    }
    if (((pIVar6->IO).KeyShift & 1U) != 0) {
      local_44 = local_44 * 10.0;
    }
  }
  else if (pIVar6->ActiveIdSource == ImGuiInputSource_Nav) {
    if (((uint)fast_factor & 0x100) == 0) {
      in_stack_ffffffffffffff84 = 0;
    }
    else {
      in_stack_ffffffffffffff84 =
           ImParseFormatPrecision
                     ((char *)CONCAT44(in_stack_ffffffffffffff8c,uVar5),in_stack_ffffffffffffff84);
    }
    local_48 = in_stack_ffffffffffffff84;
    auVar4._0_8_ = GetNavInputAmount2d((ImGuiNavDirSourceFlags)((ulong)pIVar6 >> 0x20),
                                       (ImGuiInputReadMode)pIVar6,fVar3,fast_factor);
    auVar4._8_56_ = extraout_var;
    local_50 = (ImVec2)vmovlpd_avx(auVar4._0_16_);
    pfVar2 = ImVec2::operator[](&local_50,(long)(int)fVar3);
    local_44 = *pfVar2;
    rhs = GetMinimumStepAtDecimalPrecision((int)in_XMM0_Da);
    in_XMM0_Da = ImMax<float>(in_XMM0_Da,rhs);
  }
  local_44 = in_XMM0_Da * local_44;
  if (fVar3 == 1.4013e-45) {
    local_44 = -local_44;
  }
  if (((((uint)fast_factor & 0x10000) != 0) && (in_XMM2_Da - in_XMM1_Da < 3.4028235e+38)) &&
     (1e-06 < in_XMM2_Da - in_XMM1_Da)) {
    local_44 = local_44 / (in_XMM2_Da - in_XMM1_Da);
  }
  local_83 = false;
  if ((((uint)fast_factor & 0x1000000) != 0) &&
     ((*in_RSI < in_XMM2_Da || (local_83 = true, local_44 <= 0.0)))) {
    local_83 = *in_RSI <= in_XMM1_Da && local_44 < 0.0;
  }
  if (((pIVar6->ActiveIdIsJustActivated & 1U) != 0) || (local_83)) {
    pIVar6->DragCurrentAccum = 0.0;
    pIVar6->DragCurrentAccumDirty = false;
  }
  else if ((local_44 != 0.0) || (NAN(local_44))) {
    pIVar6->DragCurrentAccum = local_44 + pIVar6->DragCurrentAccum;
    pIVar6->DragCurrentAccumDirty = true;
  }
  if ((pIVar6->DragCurrentAccumDirty & 1U) == 0) {
    bVar1 = false;
  }
  else {
    local_5c = 0.0;
    if (((uint)fast_factor & 0x10000) == 0) {
      local_58 = pIVar6->DragCurrentAccum + *in_RSI;
    }
    else {
      if (((uint)fast_factor & 0x100) != 0) {
        ImParseFormatPrecision
                  ((char *)CONCAT44(in_stack_ffffffffffffff8c,uVar5),in_stack_ffffffffffffff84);
      }
      ImPow(0.0,8.529425e-39);
      local_5c = ScaleRatioFromValueT<float,float,float>
                           (in_stack_ffffffffffffffe0,(float)((ulong)in_RDX >> 0x20),(float)in_RDX,
                            in_ECX,(bool)in_stack_ffffffffffffffd3,(float)((ulong)pIVar6 >> 0x20),
                            SUB84(pIVar6,0));
      local_58 = ScaleValueFromRatioT<float,float,float>
                           (unaff_retaddr,in_stack_fffffffffffffffc,in_EDI,
                            (float)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0),in_XMM0_Da
                            ,in_XMM1_Da);
    }
    if (((uint)in_ECX & 0x40) == 0) {
      local_58 = RoundScalarWithFormatT<float,float>
                           ((char *)CONCAT44(in_stack_fffffffffffffffc,in_EDI),
                            (ImGuiDataType)((ulong)in_RSI >> 0x20),SUB84(in_RSI,0));
    }
    pIVar6->DragCurrentAccumDirty = false;
    if (((uint)fast_factor & 0x10000) == 0) {
      pIVar6->DragCurrentAccum = pIVar6->DragCurrentAccum - (local_58 - *in_RSI);
    }
    else {
      fVar3 = ScaleRatioFromValueT<float,float,float>
                        (in_stack_ffffffffffffffe0,(float)((ulong)in_RDX >> 0x20),(float)in_RDX,
                         in_ECX,(bool)in_stack_ffffffffffffffd3,(float)((ulong)pIVar6 >> 0x20),
                         SUB84(pIVar6,0));
      pIVar6->DragCurrentAccum = pIVar6->DragCurrentAccum - (fVar3 - local_5c);
    }
    if ((local_58 == 0.0) && (!NAN(local_58))) {
      local_58 = 0.0;
    }
    if (((*in_RSI != local_58) || (NAN(*in_RSI) || NAN(local_58))) &&
       (((uint)fast_factor & 0x1000000) != 0)) {
      if ((local_58 < in_XMM1_Da) ||
         (((*in_RSI < local_58 && (local_44 < 0.0)) && (((uint)fast_factor & 0x100) == 0)))) {
        local_58 = in_XMM1_Da;
      }
      if ((in_XMM2_Da < local_58) ||
         (((local_58 < *in_RSI && (0.0 < local_44)) && (((uint)fast_factor & 0x100) == 0)))) {
        local_58 = in_XMM2_Da;
      }
    }
    if ((*in_RSI != local_58) || (NAN(*in_RSI) || NAN(local_58))) {
      *in_RSI = local_58;
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_floating_point))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_floating_point))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}